

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# live.cc
# Opt level: O0

void __thiscall
pstack::Procman::LiveReader::LiveReader(LiveReader *this,Context *c,pid_t pid,string *base)

{
  unsigned_long uVar1;
  string local_48 [32];
  string *local_28;
  string *base_local;
  Context *pCStack_18;
  pid_t pid_local;
  Context *c_local;
  LiveReader *this_local;
  
  local_28 = base;
  base_local._4_4_ = pid;
  pCStack_18 = c;
  c_local = (Context *)this;
  pstack::Context::procname((int)local_48,(string *)c);
  pstack::FileReader::FileReader(&this->super_FileReader,c,local_48);
  std::__cxx11::string::~string(local_48);
  *(undefined ***)this = &PTR__LiveReader_001f71e0;
  uVar1 = std::numeric_limits<unsigned_long>::max();
  *(unsigned_long *)&this->field_0x40 = uVar1;
  return;
}

Assistant:

LiveReader::LiveReader(Context &c, pid_t pid, const std::string &base) : FileReader(c, c.procname(pid, base)) {
   fileSize = std::numeric_limits<Reader::Off>::max();
}